

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerImpl::HandleJoinerSessionTimer(CommissionerImpl *this,Timer *aTimer)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  iterator iVar5;
  char *pcVar6;
  ByteArray *aBytes;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  TimePoint aFireTime;
  _Self __tmp;
  iterator __position;
  string_view fmt;
  format_args args;
  format_args args_00;
  writer write;
  string local_f8;
  format_string_checker<char> local_d8;
  string local_a8;
  Timer *local_88;
  _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
  *local_80;
  duration local_78;
  _Base_ptr local_70;
  long local_68;
  format_string_checker<char> *local_60 [3];
  undefined8 local_48;
  char *pcStack_40;
  
  local_68 = std::chrono::_V2::system_clock::now();
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"joiner-session","");
  local_d8.types_[0] = none_type;
  local_d8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "joiner session timer triggered";
  local_d8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
  local_d8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_d8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
  local_d8.parse_funcs_[0] = (parse_func)0x0;
  pcVar6 = "joiner session timer triggered";
  local_d8.context_.types_ = local_d8.types_;
  do {
    pcVar4 = pcVar6 + 1;
    if (*pcVar6 == '}') {
      if ((pcVar4 == "") || (*pcVar4 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar4 = pcVar6 + 2;
    }
    else if (*pcVar6 == '{') {
      pcVar4 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar6,"",&local_d8);
    }
    pcVar6 = pcVar4;
  } while (pcVar4 != "");
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_d8;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_a8,(v10 *)"joiner session timer triggered",(string_view)ZEXT816(0x1e),args);
  Log(kDebug,&local_f8,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  __position._M_node = (this->mJoinerSessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = &(this->mJoinerSessions)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (__position._M_node != local_70) {
    local_80 = (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                *)&this->mJoinerSessions;
    bVar3 = false;
    aFireTime.__d.__r = (duration)0;
    local_88 = aTimer;
    do {
      lVar2 = *(long *)(__position._M_node + 0x19);
      if (local_68 < lVar2) {
        if (lVar2 < (long)aFireTime.__d.__r) {
          aFireTime.__d.__r = (duration)(duration)lVar2;
        }
        if (!bVar3) {
          aFireTime.__d.__r = (duration)(duration)lVar2;
        }
        iVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        bVar3 = true;
      }
      else {
        local_78 = aFireTime.__d.__r;
        iVar5 = std::
                _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,ot::commissioner::JoinerSession>>>
                ::erase_abi_cxx11_(local_80,__position);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"joiner-session","");
        local_d8.types_[0] = string_type;
        local_d8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "joiner session (joiner ID={}) removed";
        local_d8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x25;
        local_d8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_d8.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_d8.context_.types_ = local_d8.types_;
        local_d8.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
        pcVar6 = "joiner session (joiner ID={}) removed";
        local_60[0] = (format_string_checker<char> *)local_d8.context_.types_;
        do {
          cVar1 = *pcVar6;
          pcVar4 = pcVar6;
          while (cVar1 != '{') {
            pcVar4 = pcVar4 + 1;
            if (pcVar4 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)local_60,pcVar6,"");
              goto LAB_001a3d34;
            }
            cVar1 = *pcVar4;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_60,pcVar6,pcVar4);
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar4,"",&local_d8);
        } while (pcVar6 != "");
LAB_001a3d34:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &__position._M_node[2]._M_left);
        utils::Hex_abi_cxx11_((string *)&local_d8,(utils *)local_60,aBytes);
        aFireTime.__d.__r = (duration)(duration)local_78.__r;
        local_48 = CONCAT44(local_d8._4_4_,local_d8.types_[0]);
        pcStack_40 = local_d8.context_.super_basic_format_parse_context<char>.format_str_.data_;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x25;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_a8,(v10 *)"joiner session (joiner ID={}) removed",fmt,args_00);
        Log(kInfo,&local_f8,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if ((size_t *)CONCAT44(local_d8._4_4_,local_d8.types_[0]) !=
            &local_d8.context_.super_basic_format_parse_context<char>.format_str_.size_) {
          operator_delete((undefined1 *)CONCAT44(local_d8._4_4_,local_d8.types_[0]));
        }
        if (local_60[0] != (format_string_checker<char> *)0x0) {
          operator_delete(local_60[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
      }
      __position._M_node = iVar5._M_node;
    } while (iVar5._M_node != local_70);
    if (bVar3) {
      Timer::Start(local_88,aFireTime);
    }
  }
  return;
}

Assistant:

void CommissionerImpl::HandleJoinerSessionTimer(Timer &aTimer)
{
    TimePoint nextShot;
    bool      hasNextShot = false;
    auto      now         = Clock::now();

    LOG_DEBUG(LOG_REGION_JOINER_SESSION, "joiner session timer triggered");

    auto it = mJoinerSessions.begin();
    while (it != mJoinerSessions.end())
    {
        auto &session = it->second;

        if (now >= session.GetExpirationTime())
        {
            it = mJoinerSessions.erase(it);

            LOG_INFO(LOG_REGION_JOINER_SESSION, "joiner session (joiner ID={}) removed",
                     utils::Hex(session.GetJoinerId()));
        }
        else
        {
            if (!hasNextShot || session.GetExpirationTime() < nextShot)
            {
                nextShot = session.GetExpirationTime();
            }
            hasNextShot = true;

            it++;
        }
    }

    if (hasNextShot)
    {
        aTimer.Start(nextShot);
    }
}